

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

Stream * rw::writeAtomicRights
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  undefined4 local_38;
  undefined4 local_34;
  uint32 buffer [2];
  Atomic *atomic;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  local_38 = **(undefined4 **)((long)object + 0x68);
  local_34 = *(undefined4 *)(*(long *)((long)object + 0x68) + 4);
  buffer = (uint32  [2])object;
  Stream::write32(stream,&local_38,8);
  return stream;
}

Assistant:

static Stream*
writeAtomicRights(Stream *stream, int32, void *object, int32, int32)
{
	Atomic *atomic = (Atomic*)object;
	uint32 buffer[2];
	buffer[0] = atomic->pipeline->pluginID;
	buffer[1] = atomic->pipeline->pluginData;
	stream->write32(buffer, 8);
	return stream;
}